

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int readline(char *line,int line_size,FILE *fp)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  
  iVar4 = -1;
  if (line != (char *)0x0) {
    pcVar1 = fgets(line,0x80,(FILE *)CONCAT44(in_register_00000034,line_size));
    if (pcVar1 != (char *)0x0) {
      if (*line != '\0') {
        sVar2 = strlen(line);
        if ((sVar2 != 0) && (line[sVar2 - 1] == '\n')) {
          line[sVar2 - 1] = '\0';
        }
      }
      iVar3 = 0;
      iVar4 = 0;
      if (*line != '\0') {
        sVar2 = strlen(line);
        iVar4 = iVar3;
        if ((sVar2 != 0) && (line[sVar2 - 1] == '\r')) {
          line[sVar2 - 1] = '\0';
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
readline(char *line, int line_size, FILE * fp)
{
    size_t len;

    if(!line) {
        return -1;
    }
    if(!fgets(line, line_size, fp)) {
        return -1;
    }

    if(*line) {
        len = strlen(line);
        if(len > 0 && line[len - 1] == '\n') {
            line[len - 1] = '\0';
        }
    }

    if(*line) {
        len = strlen(line);
        if(len > 0 && line[len - 1] == '\r') {
            line[len - 1] = '\0';
        }
    }

    return 0;
}